

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte *pbVar1;
  int iVar2;
  LogMessage *other;
  byte *pbVar3;
  ulong local_60;
  uint64 temp;
  LogFinisher local_21;
  
  pbVar3 = this->buffer_;
  pbVar1 = this->buffer_end_;
  if (((int)pbVar1 - (int)pbVar3 < 10) && ((pbVar1 <= pbVar3 || ((char)pbVar1[-1] < '\0')))) {
    iVar2 = ReadVarintSizeAsIntSlow(this);
    return iVar2;
  }
  if (-1 < (char)*pbVar3) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xffffffffffffffa0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/coded_stream.cc"
               ,0x1a1);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xffffffffffffffa0,"CHECK failed: (buffer[0]) >= (128): "
                      );
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffffa0);
  }
  iVar2 = -1;
  if ((long)(char)pbVar3[1] < 0) {
    if ((char)pbVar3[2] < '\0') {
      if ((char)pbVar3[3] < '\0') {
        if ((char)pbVar3[4] < '\0') {
          if ((char)pbVar3[5] < '\0') {
            if ((char)pbVar3[6] < '\0') {
              if ((char)pbVar3[7] < '\0') {
                if ((char)pbVar3[8] < '\0') {
                  if ((char)pbVar3[9] < '\0') {
                    return -1;
                  }
                  pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                                     (pbVar3,&stack0xffffffffffffffa0);
                }
                else {
                  pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<9ul>
                                     (pbVar3,&stack0xffffffffffffffa0);
                }
              }
              else {
                pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<8ul>
                                   (pbVar3,&stack0xffffffffffffffa0);
              }
            }
            else {
              pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<7ul>
                                 (pbVar3,&stack0xffffffffffffffa0);
            }
          }
          else {
            pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<6ul>
                               (pbVar3,&stack0xffffffffffffffa0);
          }
        }
        else {
          pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<5ul>
                             (pbVar3,&stack0xffffffffffffffa0);
        }
      }
      else {
        pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<4ul>
                           (pbVar3,&stack0xffffffffffffffa0);
      }
    }
    else {
      pbVar3 = (anonymous_namespace)::DecodeVarint64KnownSize<3ul>(pbVar3,&stack0xffffffffffffffa0);
    }
  }
  else {
    local_60 = ((long)(char)pbVar3[1] * 0x80 + (ulong)*pbVar3) - 0x80;
    pbVar3 = pbVar3 + 2;
  }
  if (local_60 < 0x80000000) {
    this->buffer_ = pbVar3;
    iVar2 = (int)local_60;
  }
  return iVar2;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64 temp;
    ::std::pair<bool, const uint8*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}